

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

string * __thiscall
cs_impl::any::holder<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>::to_string_abi_cxx11_
          (holder<std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_> *this)

{
  string *in_RDI;
  array *in_stack_000000d8;
  
  to_string<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>(in_stack_000000d8);
  return in_RDI;
}

Assistant:

std::string to_string() const override
			{
				return cs_impl::to_string(mDat);
			}